

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_test.cc
# Opt level: O0

bool intgemm::anon_unknown_0::Test<intgemm::SSE2::Kernels16>
               (float *input_unaligned,float quant_mult,size_t size)

{
  bool bVar1;
  float *__dest;
  IResultCapture *pIVar2;
  ulong in_RSI;
  void *in_RDI;
  size_t i;
  AlignedVector<short> test;
  AlignedVector<short> ref;
  AlignedVector<float> input;
  bool success;
  undefined4 in_stack_fffffffffffffe18;
  short in_stack_fffffffffffffe1c;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  byte bVar3;
  MessageBuilder *in_stack_fffffffffffffe20;
  short *in_stack_fffffffffffffe28;
  OfType type;
  MessageBuilder *in_stack_fffffffffffffe30;
  MessageBuilder *in_stack_fffffffffffffe38;
  MessageBuilder *in_stack_fffffffffffffe40;
  int16_t *in_stack_fffffffffffffe48;
  float *in_stack_fffffffffffffe50;
  SourceLineInfo local_e8;
  StringRef local_d8;
  size_t local_68;
  AlignedVector<short> local_60;
  AlignedVector<short> local_50 [2];
  AlignedVector<float> local_30;
  byte local_19;
  ulong local_18;
  void *local_8;
  
  local_19 = 1;
  local_18 = in_RSI;
  local_8 = in_RDI;
  AlignedVector<float>::AlignedVector
            ((AlignedVector<float> *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28,
             (size_t)in_stack_fffffffffffffe20);
  __dest = AlignedVector<float>::begin(&local_30);
  memcpy(__dest,local_8,local_18 << 2);
  AlignedVector<short>::AlignedVector
            ((AlignedVector<short> *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28,
             (size_t)in_stack_fffffffffffffe20);
  AlignedVector<short>::AlignedVector
            ((AlignedVector<short> *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28,
             (size_t)in_stack_fffffffffffffe20);
  AlignedVector<float>::begin(&local_30);
  AlignedVector<short>::begin(local_50);
  QuantizeRef(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
              (float)((ulong)in_stack_fffffffffffffe40 >> 0x20),(size_t)in_stack_fffffffffffffe38);
  AlignedVector<float>::begin(&local_30);
  AlignedVector<short>::begin(&local_60);
  SSE2::Kernels16::Quantize
            ((float *)in_stack_fffffffffffffe40,(int16_t *)in_stack_fffffffffffffe38,
             (float)((ulong)in_stack_fffffffffffffe30 >> 0x20),(Index)in_stack_fffffffffffffe30);
  for (local_68 = 0; local_68 < local_18; local_68 = local_68 + 1) {
    AlignedVector<float>::operator[](&local_30,local_68);
    AlignedVector<short>::operator[](local_50,local_68);
    AlignedVector<short>::operator[](&local_60,local_68);
    bVar1 = IsOff<short>(SUB84(in_stack_fffffffffffffe20,0),
                         CONCAT11(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe1e),
                         in_stack_fffffffffffffe1c);
    type = (OfType)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    if (bVar1) {
      pIVar2 = Catch::getResultCapture();
      local_d8 = operator____catch_sr
                           ((char *)in_stack_fffffffffffffe20,
                            CONCAT17(in_stack_fffffffffffffe1f,
                                     CONCAT16(in_stack_fffffffffffffe1e,
                                              CONCAT24(in_stack_fffffffffffffe1c,
                                                       in_stack_fffffffffffffe18))));
      Catch::SourceLineInfo::SourceLineInfo
                (&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/quantize_test.cc"
                 ,0x5f);
      Catch::MessageBuilder::MessageBuilder
                (in_stack_fffffffffffffe40,(StringRef *)in_stack_fffffffffffffe38,
                 (SourceLineInfo *)in_stack_fffffffffffffe30,type);
      Catch::MessageBuilder::operator<<
                (in_stack_fffffffffffffe20,
                 (char (*) [10])
                 CONCAT17(in_stack_fffffffffffffe1f,
                          CONCAT16(in_stack_fffffffffffffe1e,
                                   CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))));
      Catch::MessageBuilder::operator<<
                (in_stack_fffffffffffffe20,
                 (unsigned_long *)
                 CONCAT17(in_stack_fffffffffffffe1f,
                          CONCAT16(in_stack_fffffffffffffe1e,
                                   CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))));
      Catch::MessageBuilder::operator<<
                (in_stack_fffffffffffffe20,
                 (char (*) [7])
                 CONCAT17(in_stack_fffffffffffffe1f,
                          CONCAT16(in_stack_fffffffffffffe1e,
                                   CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))));
      AlignedVector<float>::operator[](&local_30,local_68);
      Catch::MessageBuilder::operator<<
                (in_stack_fffffffffffffe20,
                 (float *)CONCAT17(in_stack_fffffffffffffe1f,
                                   CONCAT16(in_stack_fffffffffffffe1e,
                                            CONCAT24(in_stack_fffffffffffffe1c,
                                                     in_stack_fffffffffffffe18))));
      Catch::MessageBuilder::operator<<
                (in_stack_fffffffffffffe20,
                 (char *)CONCAT17(in_stack_fffffffffffffe1f,
                                  CONCAT16(in_stack_fffffffffffffe1e,
                                           CONCAT24(in_stack_fffffffffffffe1c,
                                                    in_stack_fffffffffffffe18))));
      Catch::MessageBuilder::operator<<
                (in_stack_fffffffffffffe20,
                 (float *)CONCAT17(in_stack_fffffffffffffe1f,
                                   CONCAT16(in_stack_fffffffffffffe1e,
                                            CONCAT24(in_stack_fffffffffffffe1c,
                                                     in_stack_fffffffffffffe18))));
      Catch::MessageBuilder::operator<<
                (in_stack_fffffffffffffe20,
                 (char *)CONCAT17(in_stack_fffffffffffffe1f,
                                  CONCAT16(in_stack_fffffffffffffe1e,
                                           CONCAT24(in_stack_fffffffffffffe1c,
                                                    in_stack_fffffffffffffe18))));
      AlignedVector<float>::operator[](&local_30,local_68);
      Catch::MessageBuilder::operator<<
                (in_stack_fffffffffffffe20,
                 (float *)CONCAT17(in_stack_fffffffffffffe1f,
                                   CONCAT16(in_stack_fffffffffffffe1e,
                                            CONCAT24(in_stack_fffffffffffffe1c,
                                                     in_stack_fffffffffffffe18))));
      Catch::MessageBuilder::operator<<
                (in_stack_fffffffffffffe20,
                 (char (*) [8])
                 CONCAT17(in_stack_fffffffffffffe1f,
                          CONCAT16(in_stack_fffffffffffffe1e,
                                   CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))));
      in_stack_fffffffffffffe40 =
           (MessageBuilder *)AlignedVector<short>::operator[](local_50,local_68);
      in_stack_fffffffffffffe38 =
           Catch::MessageBuilder::operator<<
                     (in_stack_fffffffffffffe20,
                      (int *)CONCAT17(in_stack_fffffffffffffe1f,
                                      CONCAT16(in_stack_fffffffffffffe1e,
                                               CONCAT24(in_stack_fffffffffffffe1c,
                                                        in_stack_fffffffffffffe18))));
      in_stack_fffffffffffffe30 =
           Catch::MessageBuilder::operator<<
                     (in_stack_fffffffffffffe20,
                      (char (*) [9])
                      CONCAT17(in_stack_fffffffffffffe1f,
                               CONCAT16(in_stack_fffffffffffffe1e,
                                        CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18
                                                ))));
      in_stack_fffffffffffffe28 = AlignedVector<short>::operator[](&local_60,local_68);
      in_stack_fffffffffffffe20 =
           Catch::MessageBuilder::operator<<
                     (in_stack_fffffffffffffe20,
                      (int *)CONCAT17(in_stack_fffffffffffffe1f,
                                      CONCAT16(in_stack_fffffffffffffe1e,
                                               CONCAT24(in_stack_fffffffffffffe1c,
                                                        in_stack_fffffffffffffe18))));
      (*pIVar2->_vptr_IResultCapture[8])(pIVar2,in_stack_fffffffffffffe20);
      Catch::MessageBuilder::~MessageBuilder(in_stack_fffffffffffffe20);
      local_19 = 0;
    }
  }
  bVar3 = local_19;
  AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x252294);
  AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x2522a1);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x2522ae);
  return (bool)(bVar3 & 1);
}

Assistant:

bool Test(const float *input_unaligned, float quant_mult, std::size_t size) {
  using Integer = typename Backend::Integer;
  bool success = true;
  AlignedVector<float> input(size);
  std::memcpy(input.begin(), input_unaligned, sizeof(float) * size);

  AlignedVector<Integer> ref(size);
  AlignedVector<Integer> test(size);
  QuantizeRef(input.begin(), ref.begin(), quant_mult, static_cast<Index>(size));
  Backend::Quantize(input.begin(), test.begin(), quant_mult, static_cast<Index>(size));
  for (std::size_t i = 0; i < size; ++i) {
    if (IsOff(input[i] * quant_mult, ref[i], test[i])) {
      UNSCOPED_INFO("Error at " << i << " from " << input[i] << '*' << quant_mult << '=' << (input[i]*quant_mult) << " ref = " << static_cast<int>(ref[i]) << " test = " << static_cast<int>(test[i]));
      success = false;
    }
  }
  return success;
}